

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3Fts3InitTokenizer(Fts3Hash *pHash,char *zArg,sqlite3_tokenizer **ppTok,char **pzErr)

{
  sqlite3_tokenizer_module *psVar1;
  sqlite3_tokenizer **ppsVar2;
  char *pcVar3;
  size_t sVar4;
  char *pcVar5;
  size_t sVar6;
  char **ppcVar7;
  int iVar8;
  long lVar9;
  char **p;
  int n;
  char *local_58;
  char **local_50;
  sqlite3_tokenizer_module *local_48;
  sqlite3_tokenizer **local_40;
  char *local_38;
  
  n = 0;
  pcVar3 = sqlite3_mprintf("%s");
  iVar8 = 7;
  if (pcVar3 != (char *)0x0) {
    local_40 = ppTok;
    sVar4 = strlen(pcVar3);
    pcVar5 = sqlite3Fts3NextToken(pcVar3,&n);
    if (pcVar5 == (char *)0x0) {
      pcVar5 = pcVar3;
    }
    lVar9 = (long)n;
    pcVar5[lVar9] = '\0';
    sqlite3Fts3Dequote(pcVar5);
    sVar6 = strlen(pcVar5);
    local_48 = (sqlite3_tokenizer_module *)sqlite3Fts3HashFind(pHash,pcVar5,(int)sVar6 + 1);
    if (local_48 == (sqlite3_tokenizer_module *)0x0) {
      pcVar5 = sqlite3_mprintf("unknown tokenizer: %s",pcVar5);
      *pzErr = pcVar5;
      iVar8 = 1;
    }
    else {
      local_38 = pcVar3 + sVar4;
      pcVar5 = pcVar5 + lVar9;
      iVar8 = 8;
      lVar9 = 0;
      p = (char **)0x0;
      local_58 = pcVar3;
      local_50 = pzErr;
      while ((pcVar5 + 1 < local_38 &&
             (pcVar3 = sqlite3Fts3NextToken(pcVar5 + 1,&n), pcVar3 != (char *)0x0))) {
        ppcVar7 = (char **)sqlite3_realloc(p,iVar8);
        if (ppcVar7 == (char **)0x0) {
          sqlite3_free(local_58);
          sqlite3_free(p);
          return 7;
        }
        ppcVar7[lVar9] = pcVar3;
        pcVar5 = pcVar3 + n;
        pcVar3[n] = '\0';
        sqlite3Fts3Dequote(pcVar3);
        iVar8 = iVar8 + 8;
        lVar9 = lVar9 + 1;
        p = ppcVar7;
      }
      ppsVar2 = local_40;
      psVar1 = local_48;
      iVar8 = (*local_48->xCreate)((int)lVar9,p,local_40);
      if (iVar8 == 0) {
        (*ppsVar2)->pModule = psVar1;
      }
      else {
        pcVar3 = sqlite3_mprintf("unknown tokenizer");
        *local_50 = pcVar3;
      }
      pcVar3 = local_58;
      sqlite3_free(p);
    }
    sqlite3_free(pcVar3);
  }
  return iVar8;
}

Assistant:

SQLITE_PRIVATE int sqlite3Fts3InitTokenizer(
  Fts3Hash *pHash,                /* Tokenizer hash table */
  const char *zArg,               /* Tokenizer name */
  sqlite3_tokenizer **ppTok,      /* OUT: Tokenizer (if applicable) */
  char **pzErr                    /* OUT: Set to malloced error message */
){
  int rc;
  char *z = (char *)zArg;
  int n = 0;
  char *zCopy;
  char *zEnd;                     /* Pointer to nul-term of zCopy */
  sqlite3_tokenizer_module *m;

  zCopy = sqlite3_mprintf("%s", zArg);
  if( !zCopy ) return SQLITE_NOMEM;
  zEnd = &zCopy[strlen(zCopy)];

  z = (char *)sqlite3Fts3NextToken(zCopy, &n);
  if( z==0 ){
    assert( n==0 );
    z = zCopy;
  }
  z[n] = '\0';
  sqlite3Fts3Dequote(z);

  m = (sqlite3_tokenizer_module *)sqlite3Fts3HashFind(pHash,z,(int)strlen(z)+1);
  if( !m ){
    *pzErr = sqlite3_mprintf("unknown tokenizer: %s", z);
    rc = SQLITE_ERROR;
  }else{
    char const **aArg = 0;
    int iArg = 0;
    z = &z[n+1];
    while( z<zEnd && (NULL!=(z = (char *)sqlite3Fts3NextToken(z, &n))) ){
      int nNew = sizeof(char *)*(iArg+1);
      char const **aNew = (const char **)sqlite3_realloc((void *)aArg, nNew);
      if( !aNew ){
        sqlite3_free(zCopy);
        sqlite3_free((void *)aArg);
        return SQLITE_NOMEM;
      }
      aArg = aNew;
      aArg[iArg++] = z;
      z[n] = '\0';
      sqlite3Fts3Dequote(z);
      z = &z[n+1];
    }
    rc = m->xCreate(iArg, aArg, ppTok);
    assert( rc!=SQLITE_OK || *ppTok );
    if( rc!=SQLITE_OK ){
      *pzErr = sqlite3_mprintf("unknown tokenizer");
    }else{
      (*ppTok)->pModule = m; 
    }
    sqlite3_free((void *)aArg);
  }

  sqlite3_free(zCopy);
  return rc;
}